

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SchemaValidator::faultInAttr(SchemaValidator *this,XMLAttr *toFill,XMLAttDef *attDef)

{
  AttTypes AVar1;
  long lVar2;
  XMLCh *newValue;
  
  lVar2 = *(long *)&attDef[1].fCreateReason;
  newValue = attDef->fValue;
  AVar1 = attDef->fType;
  QName::setName(toFill->fAttName,*(XMLCh **)(lVar2 + 0x28),*(XMLCh **)(lVar2 + 0x30),
                 *(uint *)(lVar2 + 0x20));
  XMLAttr::setValue(toFill,newValue);
  toFill->fType = AVar1;
  return;
}

Assistant:

void SchemaValidator::faultInAttr (XMLAttr&    toFill, const XMLAttDef&  attDef)   const
{
    //
    //  At this level, we cannot set the URI id. So we just set it to zero
    //  and leave it at that. The scanner, who called us, will look at the
    //  prefix we stored (if any), resolve it, and store the URL id if any.
    //
    SchemaAttDef* schemaAttDef = (SchemaAttDef*) &attDef;
    QName* attName = schemaAttDef->getAttName();

    toFill.set
    (
          attName->getURI()
        , attName->getLocalPart()
        , attName->getPrefix()
        , schemaAttDef->getValue()
        , schemaAttDef->getType()
    );
}